

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-cave-view.c
# Opt level: O2

void borg_forget_view(void)

{
  long lVar1;
  
  if (borg_view_n != 0) {
    for (lVar1 = 0; lVar1 < borg_view_n; lVar1 = lVar1 + 1) {
      borg_grids[borg_view_y[lVar1]][borg_view_x[lVar1]].info =
           borg_grids[borg_view_y[lVar1]][borg_view_x[lVar1]].info & 0xffdf;
    }
    borg_view_n = 0;
  }
  return;
}

Assistant:

void borg_forget_view(void)
{
    int i;

    borg_grid *ag;

    /* None to forget */
    if (!borg_view_n)
        return;

    /* Clear them all */
    for (i = 0; i < borg_view_n; i++) {
        int y = borg_view_y[i];
        int x = borg_view_x[i];

        /* Access the grid */
        ag = &borg_grids[y][x];

        /* Forget that the grid is viewable */
        ag->info &= ~BORG_VIEW;
    }

    /* None left */
    borg_view_n = 0;
}